

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchBase.h
# Opt level: O0

optional<std::basic_string_view<char,_std::char_traits<char>_>_> * __thiscall
SearchBase::findLinkToSubtoken
          (optional<std::basic_string_view<char,_std::char_traits<char>_>_> *__return_storage_ptr__,
          SearchBase *this,string *htmlPage,string_view subtoken,string *capsulationBegin,
          string *capsulationEnd)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view subtoken_00;
  string_view strv;
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  size_type sVar5;
  size_type sVar6;
  undefined1 auVar7 [16];
  size_t link_token_end_pos;
  size_t link_token_begin_pos;
  string_view link;
  size_t capsulationEnd_pos;
  string_view token_element;
  size_t capsulationBegin_pos;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string tokenWithCapsulationbegin;
  string_view link_token_end;
  string_view link_token_begin;
  string *capsulationBegin_local;
  string *htmlPage_local;
  SearchBase *this_local;
  string_view subtoken_local;
  
  subtoken_local._M_len = (size_t)subtoken._M_str;
  this_local = (SearchBase *)subtoken._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&link_token_end._M_str,"<a href=\""
            );
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             ((long)&tokenWithCapsulationbegin.field_2 + 8),"\"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_90,(basic_string_view<char,_std::char_traits<char>_> *)&this_local,
             &local_91);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 capsulationBegin,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  token_element._M_str = (char *)std::__cxx11::string::find((string *)htmlPage,(ulong)local_70);
  do {
    if (token_element._M_str == (char *)0xffffffffffffffff) {
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                (__return_storage_ptr__);
LAB_00275bfc:
      std::__cxx11::string::~string((string *)local_70);
      return __return_storage_ptr__;
    }
    auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)htmlPage);
    pcVar2 = token_element._M_str;
    token_element._M_len = auVar7._8_8_;
    capsulationEnd_pos = auVar7._0_8_;
    lVar4 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&capsulationEnd_pos,
               (size_type)(pcVar2 + lVar4));
    bVar1 = (basic_string_view<char,_std::char_traits<char>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)capsulationEnd);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)&capsulationEnd_pos,bVar1
                       ,0);
    if (sVar5 == 0xffffffffffffffff) {
      std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                (__return_storage_ptr__);
      goto LAB_00275bfc;
    }
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::length
                      ((basic_string_view<char,_std::char_traits<char>_> *)&capsulationEnd_pos);
    std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
              ((basic_string_view<char,_std::char_traits<char>_> *)&capsulationEnd_pos,sVar6 - sVar5
              );
    link._M_str = (char *)this_local;
    strv._M_str = (char *)token_element._M_len;
    strv._M_len = capsulationEnd_pos;
    subtoken_00._M_str = (char *)subtoken_local._M_len;
    subtoken_00._M_len = (size_t)this_local;
    bVar3 = isSubtoken(this,strv,subtoken_00);
    if (bVar3) {
      auVar7 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)htmlPage);
      link._M_len = auVar7._8_8_;
      link_token_begin_pos = auVar7._0_8_;
      bVar1._M_str = (char *)link_token_begin._M_len;
      bVar1._M_len = (size_t)link_token_end._M_str;
      sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                        ((basic_string_view<char,_std::char_traits<char>_> *)&link_token_begin_pos,
                         bVar1,(size_type)token_element._M_str);
      if (sVar5 == 0xffffffffffffffff) {
        std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                  (__return_storage_ptr__);
      }
      else {
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::length
                          ((basic_string_view<char,_std::char_traits<char>_> *)
                           &link_token_end._M_str);
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)&link_token_begin_pos,
                   sVar5 + sVar6);
        __str._M_str = (char *)link_token_end._M_len;
        __str._M_len = tokenWithCapsulationbegin.field_2._8_8_;
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)&link_token_begin_pos
                           ,__str,0);
        if (sVar5 == 0xffffffffffffffff) {
          std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::optional
                    (__return_storage_ptr__);
        }
        else {
          sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::length
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &link_token_begin_pos);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_suffix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&link_token_begin_pos,
                     sVar6 - sVar5);
          std::optional<std::basic_string_view<char,_std::char_traits<char>_>_>::
          optional<std::basic_string_view<char,_std::char_traits<char>_>,_true>
                    (__return_storage_ptr__,
                     (basic_string_view<char,_std::char_traits<char>_> *)&link_token_begin_pos);
        }
      }
      goto LAB_00275bfc;
    }
    std::__cxx11::string::length();
    token_element._M_str = (char *)std::__cxx11::string::find((string *)htmlPage,(ulong)local_70);
  } while( true );
}

Assistant:

std::optional<std::string_view> findLinkToSubtoken(const std::string& htmlPage, std::string_view subtoken, const std::string& capsulationBegin, const std::string& capsulationEnd) const {
		const std::string_view link_token_begin = "<a href=\"";
		const std::string_view link_token_end = "\"";

		const std::string tokenWithCapsulationbegin = capsulationBegin + std::string(subtoken);

		size_t capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin);
		while (capsulationBegin_pos != std::string::npos) {
			std::string_view token_element = std::string_view(htmlPage);
			token_element.remove_prefix(capsulationBegin_pos + capsulationBegin.length());

			const size_t capsulationEnd_pos = token_element.find(capsulationEnd);
			if (capsulationEnd_pos == std::string::npos) {
				return {};
			}
			token_element.remove_suffix(token_element.length() - capsulationEnd_pos);

			if (isSubtoken(token_element, subtoken)) {
				std::string_view link = std::string_view(htmlPage);
				const size_t link_token_begin_pos = link.rfind(link_token_begin, capsulationBegin_pos);
				if (link_token_begin_pos == std::string::npos) {
					return {};
				}
				link.remove_prefix(link_token_begin_pos + link_token_begin.length());


				const size_t link_token_end_pos = link.find(link_token_end);
				if (link_token_end_pos == std::string::npos) {
					return {};
				}
				link.remove_suffix(link.length() - link_token_end_pos);

				return link;
			}

			capsulationBegin_pos = htmlPage.find(tokenWithCapsulationbegin, capsulationBegin_pos + tokenWithCapsulationbegin.length());
		}
		return {};
	}